

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

TokenDetail * __thiscall anon_unknown.dwarf_79cbb::ParserImpl::NextToken(ParserImpl *this)

{
  TokenDetail *detail;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aVar1;
  String *pSVar2;
  int iVar3;
  int iVar4;
  
  detail = &this->current_;
  if ((this->look_ahead_).token_ == 0x11e) {
    luna::Lexer::GetToken(this->lexer_,detail);
  }
  else {
    aVar1 = (this->look_ahead_).field_0;
    pSVar2 = (this->look_ahead_).module_;
    iVar3 = (this->look_ahead_).column_;
    iVar4 = (this->look_ahead_).token_;
    *(undefined8 *)((long)&(this->current_).module_ + 4) =
         *(undefined8 *)((long)&(this->look_ahead_).module_ + 4);
    (this->current_).column_ = iVar3;
    (this->current_).token_ = iVar4;
    detail->field_0 = aVar1;
    (this->current_).module_ = pSVar2;
    aVar1 = (this->look_ahead2_).field_0;
    pSVar2 = (this->look_ahead2_).module_;
    iVar3 = (this->look_ahead2_).column_;
    iVar4 = (this->look_ahead2_).token_;
    *(undefined8 *)((long)&(this->look_ahead_).module_ + 4) =
         *(undefined8 *)((long)&(this->look_ahead2_).module_ + 4);
    (this->look_ahead_).column_ = iVar3;
    (this->look_ahead_).token_ = iVar4;
    (this->look_ahead_).field_0 = aVar1;
    (this->look_ahead_).module_ = pSVar2;
    if ((this->look_ahead2_).token_ != 0x11e) {
      (this->look_ahead2_).token_ = 0x11e;
    }
  }
  return detail;
}

Assistant:

TokenDetail& NextToken()
        {
            if (look_ahead_.token_ != Token_EOF)
            {
                current_ = look_ahead_;
                look_ahead_ = look_ahead2_;
                if (look_ahead2_.token_ != Token_EOF)
                    look_ahead2_.token_ = Token_EOF;
            }
            else
            {
                lexer_->GetToken(&current_);
            }

            return current_;
        }